

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_bool nk_menu_begin_text(nk_context *ctx,char *title,int len,nk_flags align,nk_vec2 size)

{
  nk_window *win;
  nk_widget_layout_states nVar1;
  nk_bool nVar2;
  int iVar3;
  nk_context *in;
  nk_rect bounds;
  nk_rect header_00;
  nk_rect header;
  
  nVar1 = NK_WIDGET_INVALID;
  if (((ctx != (nk_context *)0x0) &&
      (win = ctx->current, nVar1 = NK_WIDGET_INVALID, win != (nk_window *)0x0)) &&
     (win->layout != (nk_panel *)0x0)) {
    nVar1 = nk_widget(&header,ctx);
    if (nVar1 != NK_WIDGET_INVALID) {
      if (nVar1 == NK_WIDGET_ROM) {
        in = (nk_context *)0x0;
      }
      else {
        in = (nk_context *)0x0;
        if ((win->flags & 0x1000) == 0) {
          in = ctx;
        }
      }
      bounds.w = header.w;
      bounds.h = header.h;
      bounds.x = header.x;
      bounds.y = header.y;
      nVar2 = nk_do_button_text(&ctx->last_widget_state,&win->buffer,bounds,title,len,align,
                                NK_BUTTON_DEFAULT,&(ctx->style).menu_button,&in->input,
                                (ctx->style).font);
      header_00.w = header.w;
      header_00.h = header.h;
      header_00.x = header.x;
      header_00.y = header.y;
      iVar3 = nk_menu_begin(ctx,win,title,(uint)(nVar2 != 0),header_00,size);
      return iVar3;
    }
  }
  return nVar1;
}

Assistant:

NK_API nk_bool
nk_menu_begin_text(struct nk_context *ctx, const char *title, int len,
nk_flags align, struct nk_vec2 size)
{
struct nk_window *win;
const struct nk_input *in;
struct nk_rect header;
int is_clicked = nk_false;
nk_flags state;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
state = nk_widget(&header, ctx);
if (!state) return 0;
in = (state == NK_WIDGET_ROM || win->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
if (nk_do_button_text(&ctx->last_widget_state, &win->buffer, header,
title, len, align, NK_BUTTON_DEFAULT, &ctx->style.menu_button, in, ctx->style.font))
is_clicked = nk_true;
return nk_menu_begin(ctx, win, title, is_clicked, header, size);
}